

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O1

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  long lVar7;
  size_t sVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  short sVar13;
  uint uVar14;
  int iVar15;
  uint *puVar16;
  int iVar17;
  uint *puVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  bool bVar22;
  char buffer [4];
  undefined4 local_34;
  
  if (hbSize < 4) {
    local_34 = 0;
    memcpy(&local_34,headerBuffer,hbSize);
    sVar6 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,&local_34,4);
    sVar8 = 0xfffffffffffffffc;
    if (sVar6 <= hbSize) {
      sVar8 = sVar6;
    }
    if (0xfffffffffffffff7 < sVar6) {
      sVar8 = sVar6;
    }
  }
  else {
    uVar14 = *headerBuffer;
    uVar19 = uVar14 & 0xf;
    sVar8 = 0xfffffffffffffffb;
    if (uVar19 < 0xb) {
      *tableLogPtr = uVar19 + 5;
      iVar21 = 0x20 << (sbyte)uVar19;
      uVar4 = *maxSVPtr;
      iVar17 = iVar21 + 1;
      iVar20 = uVar19 + 6;
      uVar14 = uVar14 >> 4;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar16 = (uint *)((long)headerBuffer + (hbSize - 4));
      uVar19 = 4;
      bVar22 = true;
      uVar12 = 0;
      puVar18 = (uint *)headerBuffer;
      do {
        uVar11 = uVar12;
        if (!bVar22) {
          sVar13 = (short)uVar14;
          uVar5 = uVar12;
          while (sVar13 == -1) {
            if (puVar18 < (uint *)((long)headerBuffer + (hbSize - 5))) {
              puVar3 = (uint *)((long)puVar18 + 2);
              puVar18 = (uint *)((long)puVar18 + 2);
              uVar14 = *puVar3 >> ((byte)uVar19 & 0x1f);
            }
            else {
              uVar14 = uVar14 >> 0x10;
              uVar19 = uVar19 + 0x10;
            }
            uVar5 = uVar5 + 0x18;
            sVar13 = (short)uVar14;
          }
          for (; (uVar14 & 3) == 3; uVar14 = uVar14 >> 2) {
            uVar5 = uVar5 + 3;
            uVar19 = uVar19 + 2;
          }
          uVar5 = uVar5 + (uVar14 & 3);
          uVar19 = uVar19 + 2;
          if (uVar5 <= uVar4) {
            if (uVar12 < uVar5) {
              memset(normalizedCounter + uVar12,0,(ulong)(~uVar12 + uVar5) * 2 + 2);
              lVar7 = 0;
              do {
                lVar7 = lVar7 + -1;
              } while ((ulong)uVar12 - (ulong)uVar5 != lVar7);
              uVar12 = uVar12 - (int)lVar7;
            }
            iVar10 = (int)uVar19 >> 3;
            if ((puVar2 < puVar18) && (puVar16 < (uint *)((long)iVar10 + (long)puVar18))) {
              uVar14 = uVar14 >> 2;
            }
            else {
              puVar3 = (uint *)((long)puVar18 + (long)iVar10);
              puVar18 = (uint *)((long)puVar18 + (long)iVar10);
              uVar19 = uVar19 & 7;
              uVar14 = *puVar3 >> (sbyte)uVar19;
            }
          }
          uVar11 = uVar12;
          if (uVar4 < uVar5) {
            return 0xfffffffffffffff9;
          }
        }
        uVar12 = iVar21 * 2 - 1;
        uVar9 = uVar12 - iVar17;
        uVar5 = iVar21 - 1U & uVar14;
        if (uVar5 < uVar9) {
          iVar10 = iVar20 + -1;
        }
        else {
          uVar14 = uVar14 & uVar12;
          if ((int)uVar14 < iVar21) {
            uVar9 = 0;
          }
          uVar5 = uVar14 - uVar9;
          iVar10 = iVar20;
        }
        iVar1 = uVar5 - 1;
        iVar15 = 1 - uVar5;
        if (0 < (int)uVar5) {
          iVar15 = iVar1;
        }
        iVar17 = iVar17 - iVar15;
        normalizedCounter[uVar11] = (short)iVar1;
        bVar22 = iVar1 != 0;
        for (; iVar17 < iVar21; iVar21 = iVar21 >> 1) {
          iVar20 = iVar20 + -1;
        }
        uVar19 = iVar10 + uVar19;
        if ((puVar2 < puVar18) && (puVar16 < (uint *)((long)((int)uVar19 >> 3) + (long)puVar18))) {
          uVar19 = uVar19 + ((int)puVar18 - (int)puVar16) * 8;
          puVar18 = puVar16;
        }
        else {
          puVar18 = (uint *)((long)puVar18 + (long)((int)uVar19 >> 3));
          uVar19 = uVar19 & 7;
        }
        uVar12 = uVar11 + 1;
        uVar14 = *puVar18 >> ((byte)uVar19 & 0x1f);
      } while ((1 < iVar17) && (uVar12 <= uVar4));
      sVar8 = 0xfffffffffffffffc;
      if ((iVar17 == 1) && ((int)uVar19 < 0x21)) {
        for (; uVar12 <= uVar4; uVar12 = uVar12 + 1) {
          normalizedCounter[uVar12] = 0;
        }
        *maxSVPtr = uVar11;
        sVar8 = (long)puVar18 + ((long)((int)(uVar19 + 7) >> 3) - (long)headerBuffer);
      }
    }
  }
  return sVar8;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    DEBUGLOG(5, "FSE_readNCount");

    if (hbSize < 4) {
        /* This function only works when hbSize >= 4 */
        char buffer[4];
        memset(buffer, 0, sizeof(buffer));
        memcpy(buffer, headerBuffer, hbSize);
        {   size_t const countSize = FSE_readNCount(normalizedCounter, maxSVPtr, tableLogPtr,
                                                    buffer, sizeof(buffer));
            if (FSE_isError(countSize)) return countSize;
            if (countSize > hbSize) return ERROR(corruption_detected);
            return countSize;
    }   }
    assert(hbSize >= 4);

    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                assert((bitCount >> 3) <= 3); /* For first condition to work */
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    /* zeroise the rest */
    {   unsigned symbNb = charnum;
        for (symbNb=charnum; symbNb <= *maxSVPtr; symbNb++)
            normalizedCounter[symbNb] = 0;
    }
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}